

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

TemporaryCopy __thiscall
diligent_spirv_cross::CompilerGLSL::handle_instruction_precision
          (CompilerGLSL *this,Instruction *instruction)

{
  ushort uVar1;
  uint length;
  bool bVar2;
  uint32_t *args;
  iterator iVar3;
  ulong uVar4;
  SPIRExtension *pSVar5;
  uint32_t *args_00;
  ulong uVar6;
  uint32_t dst_id;
  uint32_t type_id;
  uint32_t length_00;
  uint32_t result_id;
  uint32_t result_type;
  
  args = Compiler::stream(&this->super_Compiler,instruction);
  if ((this->backend).requires_relaxed_precision_analysis == true) {
    uVar1 = instruction->op;
    length = instruction->length;
    if (2 < length) {
      length_00 = length - 2;
      if (((uVar1 - 0x6d < 0x27) && ((0x7ffffe007fU >> ((ulong)(uVar1 - 0x6d) & 0x3f) & 1) != 0)) ||
         (uVar1 - 0xcf < 9)) {
        type_id = *args;
        dst_id = args[1];
        args_00 = args + 2;
      }
      else {
        if (length < 5 || uVar1 != 0xc) {
          uVar4 = (ulong)(uVar1 - 0x3d);
          if (uVar1 - 0x3d < 0x28) {
            if ((0xbffe510031U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0064192c;
            if (uVar4 == 0x12) {
              length_00 = 2;
            }
            else if (uVar4 != 0x13) goto LAB_0064190d;
          }
          else {
LAB_0064190d:
            if ((0xf < uVar1 - 0x131) || ((0x87ffU >> (uVar1 - 0x131 & 0x1f) & 1) == 0))
            goto LAB_0064184b;
LAB_0064192c:
            length_00 = 1;
          }
          forward_relaxed_precision(this,args[1],args + 2,length_00);
          goto LAB_0064184b;
        }
        pSVar5 = Compiler::get<diligent_spirv_cross::SPIRExtension>(&this->super_Compiler,args[2]);
        if (*(int *)&(pSVar5->super_IVariant).field_0xc != 1) goto LAB_0064184b;
        type_id = *args;
        dst_id = args[1];
        args_00 = args + 4;
        length_00 = length - 4;
      }
      analyze_precision_requirements(this,type_id,dst_id,args_00,length_00);
    }
LAB_0064184b:
    _result_id = 0;
    bVar2 = Compiler::instruction_to_result_type
                      (&this->super_Compiler,&result_type,&result_id,(uint)uVar1,args,length);
    if ((bVar2) &&
       (iVar3 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->temporary_to_mirror_precision_alias)._M_h,args + 1),
       iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
       (__node_type *)0x0)) {
      uVar4 = (ulong)*(uint *)((long)iVar3.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur + 0xc);
      uVar6 = (ulong)*(uint *)((long)iVar3.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur + 8) << 0x20;
      goto LAB_00641899;
    }
  }
  uVar4 = 0;
  uVar6 = 0;
LAB_00641899:
  return (TemporaryCopy)(uVar4 | uVar6);
}

Assistant:

CompilerGLSL::TemporaryCopy CompilerGLSL::handle_instruction_precision(const Instruction &instruction)
{
	auto ops = stream_mutable(instruction);
	auto opcode = static_cast<Op>(instruction.op);
	uint32_t length = instruction.length;

	if (backend.requires_relaxed_precision_analysis)
	{
		if (length > 2)
		{
			uint32_t forwarding_length = length - 2;

			if (opcode_is_precision_sensitive_operation(opcode))
				analyze_precision_requirements(ops[0], ops[1], &ops[2], forwarding_length);
			else if (opcode == OpExtInst && length >= 5 && get<SPIRExtension>(ops[2]).ext == SPIRExtension::GLSL)
				analyze_precision_requirements(ops[0], ops[1], &ops[4], forwarding_length - 2);
			else if (opcode_is_precision_forwarding_instruction(opcode, forwarding_length))
				forward_relaxed_precision(ops[1], &ops[2], forwarding_length);
		}

		uint32_t result_type = 0, result_id = 0;
		if (instruction_to_result_type(result_type, result_id, opcode, ops, length))
		{
			auto itr = temporary_to_mirror_precision_alias.find(ops[1]);
			if (itr != temporary_to_mirror_precision_alias.end())
				return { itr->second, itr->first };
		}
	}

	return {};
}